

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

FilePath *
testing::internal::FilePath::ConcatPaths
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *relative_path)

{
  undefined1 local_80 [8];
  FilePath dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((directory->pathname_)._M_string_length == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,&relative_path->pathname_);
  }
  else {
    RemoveTrailingPathSeparator((FilePath *)local_80,directory);
    std::operator+(&local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,'/'
                  );
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&dir.pathname_.field_2 + 8),&local_40,&relative_path->pathname_);
    FilePath(__return_storage_ptr__,(string *)((long)&dir.pathname_.field_2 + 8));
    std::__cxx11::string::~string((string *)(dir.pathname_.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::ConcatPaths(const FilePath& directory,
                               const FilePath& relative_path) {
  if (directory.IsEmpty())
    return relative_path;
  const FilePath dir(directory.RemoveTrailingPathSeparator());
  return FilePath(dir.string() + kPathSeparator + relative_path.string());
}